

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall libtorrent::aux::peer_list::set_failcount(peer_list *this,torrent_peer *p,int f)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  uVar1 = *(uint *)&p->field_0x1b;
  if ((p->connection == (peer_connection_interface *)0x0) && ((uVar1 & 0x88000020) == 0x20)) {
    if (((char)uVar1 < '\0') && (*(int *)&this->field_0x60 < 0)) {
      bVar2 = false;
    }
    else {
      bVar2 = (int)(uVar1 & 0x1f) < this->m_max_failcount;
    }
    *(uint *)&p->field_0x1b = uVar1 & 0x77ffffe0 | f & 0x1fU;
    if (((char)uVar1 < '\0') && (*(int *)&this->field_0x60 < 0)) {
      bVar5 = bVar2 == false;
      bVar2 = true;
      if (bVar5) {
        return;
      }
    }
    else if (bVar2 == (int)(f & 0x1fU) < this->m_max_failcount) {
      return;
    }
    iVar3 = (-(uint)bVar2 | 1) + this->m_num_connect_candidates;
    iVar4 = 0;
    if (0 < iVar3) {
      iVar4 = iVar3;
    }
    if (bVar2 == false) {
      iVar4 = iVar3;
    }
    this->m_num_connect_candidates = iVar4;
    return;
  }
  *(uint *)&p->field_0x1b = uVar1 & 0xffffffe0 | f & 0x1fU;
  return;
}

Assistant:

bool peer_list::is_connect_candidate(torrent_peer const& p) const
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(p.in_use);
		if (p.connection
			|| p.banned
			|| p.web_seed
			|| !p.connectable
			|| (p.seed && m_finished)
			|| int(p.failcount) >= m_max_failcount)
			return false;

#if TORRENT_USE_RTC
		// unsolicited connections over RTC  is not possible
		if (p.is_rtc_addr) return false;
#endif

		return true;
	}